

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.c
# Opt level: O3

void obj1undo(mcmcxdef *mctx,objucxdef *undoctx)

{
  uchar uVar1;
  ushort uVar2;
  ushort uVar3;
  prpnum prop;
  mcmon objnum;
  uint uVar4;
  uchar *puVar5;
  
  uVar2 = undoctx->objucxprv;
  if (uVar2 == undoctx->objucxhead) {
    errsigf(undoctx->objucxerr,"TADS",0xc9);
  }
  undoctx->objucxhead = uVar2;
  uVar1 = undoctx->objucxbuf[uVar2];
  uVar3 = uVar2;
  if (uVar2 != undoctx->objucxtail) {
    uVar3 = *(ushort *)(undoctx->objucxbuf + (ulong)uVar2 + 1);
  }
  undoctx->objucxprv = uVar3;
  if (uVar1 != '\x03') {
    if (uVar1 == '\x05') {
      (*undoctx->objucxcun)(undoctx->objucxccx,undoctx->objucxbuf + (ulong)uVar2 + 3);
      return;
    }
    prop = *(prpnum *)(undoctx->objucxbuf + (ulong)uVar2 + 5);
    objnum = *(mcmon *)(undoctx->objucxbuf + (ulong)uVar2 + 3);
    puVar5 = mcmlck(mctx,objnum);
    uVar3 = *(ushort *)(puVar5 + 2);
    mcmunlck(mctx,objnum);
    if (uVar1 == '\x04') {
      objdelp(mctx,objnum,prop,0);
      uVar4 = objgetp(mctx,objnum,prop,(dattyp *)0x0);
      puVar5 = mcmlck(mctx,objnum);
      puVar5[(ulong)(uVar4 & 0xffff) + 5] = puVar5[(ulong)(uVar4 & 0xffff) + 5] & 0xfd;
      mcmunlck(mctx,objnum);
      return;
    }
    if (uVar1 == '\x02') {
      objsetp(mctx,objnum,prop,(uint)undoctx[1].objucxbuf[(ulong)uVar2 - 0x37],
              undoctx[1].objucxbuf + ((ulong)uVar2 - 0x33),(objucxdef *)0x0);
      return;
    }
    if (uVar1 == '\x01') {
      objdelp(mctx,objnum,prop,0);
      if ((uVar3 & 2) != 0) {
        objindx(mctx,objnum);
        return;
      }
    }
  }
  return;
}

Assistant:

void obj1undo(mcmcxdef *mctx, objucxdef *undoctx)
{
    uchar  *p;
    prpnum  prop;
    objnum  objn;
    uchar   cmd;
    uchar   pr[PRPHDRSIZ];                     /* space for property header */
    ushort  prv;
    ushort  pofs;
    objdef *objptr;
    int     indexed;

    /* if there's no more undo, signal an error */
    if (undoctx->objucxprv == undoctx->objucxhead)
        errsig(undoctx->objucxerr, ERR_NOUNDO);
    
    /* move back to previous record */
    undoctx->objucxhead = undoctx->objucxprv;
    p = &undoctx->objucxbuf[undoctx->objucxprv];
    
    /* get command, and set undocxprv to previous record */
    cmd = *p++;
    memcpy(&prv, p, sizeof(prv));
    p += sizeof(prv);
    
    /* if we're at the tail, no more undo; otherwise, use back link */
    if (undoctx->objucxprv == undoctx->objucxtail)
        undoctx->objucxprv = undoctx->objucxhead;
    else
        undoctx->objucxprv = prv;
    
    if (cmd == OBJUSAV) return;       /* savepointer marker - nothing to do */
    
    /* get object/property information for property-changing undo */
    if (cmd != OBJUCLI)
    {
        memcpy(&objn, p, (size_t)sizeof(objn));
        p += sizeof(objn);
        memcpy(&prop, p, (size_t)sizeof(prop));
        p += sizeof(prop);
        objptr = mcmlck(mctx, objn);
        indexed = (objflg(objptr) & OBJFINDEX);
        mcmunlck(mctx, objn);
    }
    
    switch(cmd)
    {
    case OBJUADD:
        objdelp(mctx, objn, prop, FALSE);
        if (indexed) objindx(mctx, objn);
        break;
        
    case OBJUOVR:
        objdelp(mctx, objn, prop, FALSE);  /* delete the non-original value */
        pofs = objgetp(mctx, objn, prop, (dattyp *)0);  /* get ignored prop */
        objptr = (objdef *)mcmlck(mctx, objn);           /* lock the object */
        prpflg(objofsp(objptr, pofs)) &= ~PRPFIGN;     /* no longer ignored */
        mcmunlck(mctx, objn);                          /* unlock the object */
        break;
        
    case OBJUCHG:
        memcpy(pr, p, (size_t)PRPHDRSIZ);
        p += PRPHDRSIZ;
        objsetp(mctx, objn, prop, prptype(pr), (void *)p, (objucxdef *)0);
        break;
        
    case OBJUCLI:
        (*undoctx->objucxcun)(undoctx->objucxccx, p);
        break;
    }
}